

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char sqlite3ExprAffinity(Expr *pExpr)

{
  short sVar1;
  byte bVar2;
  char cVar3;
  
code_r0x00188c47:
  do {
    while( true ) {
      for (; (pExpr->flags & 0x42000) != 0; pExpr = pExpr->pLeft) {
      }
      bVar2 = pExpr->op;
      if (bVar2 == 0xb0) {
        bVar2 = pExpr->op2;
      }
      if (0xa8 < bVar2) break;
      if (bVar2 != 0x8a) {
        if (bVar2 == 0x24) {
          cVar3 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
          return cVar3;
        }
        if (bVar2 != 0xa7) {
LAB_00188cea:
          return pExpr->affExpr;
        }
LAB_00188cc0:
        sVar1 = pExpr->iColumn;
        cVar3 = 'D';
        if ((-1 < (long)sVar1) && (sVar1 < ((pExpr->y).pTab)->nCol)) {
          cVar3 = ((pExpr->y).pTab)->aCol[sVar1].affinity;
        }
        return cVar3;
      }
      pExpr = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
    }
    if (bVar2 != 0xb1) {
      if (bVar2 != 0xb2) {
        if (bVar2 != 0xa9) goto LAB_00188cea;
        goto LAB_00188cc0;
      }
      pExpr = ((pExpr->pLeft->x).pSelect)->pEList->a[pExpr->iColumn].pExpr;
      goto code_r0x00188c47;
    }
    pExpr = ((pExpr->x).pList)->a[0].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(const Expr *pExpr){
  int op;
  while( ExprHasProperty(pExpr, EP_Skip|EP_IfNullRow) ){
    assert( pExpr->op==TK_COLLATE
         || pExpr->op==TK_IF_NULL_ROW
         || (pExpr->op==TK_REGISTER && pExpr->op2==TK_IF_NULL_ROW) );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_COLUMN || op==TK_AGG_COLUMN ){
    assert( ExprUseYTab(pExpr) );
    assert( pExpr->y.pTab!=0 );
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pExpr) );
    assert( pExpr->x.pSelect!=0 );
    assert( pExpr->x.pSelect->pEList!=0 );
    assert( pExpr->x.pSelect->pEList->a[0].pExpr!=0 );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft!=0 && ExprUseXSelect(pExpr->pLeft) );
    assert( pExpr->iColumn < pExpr->iTable );
    assert( pExpr->iTable==pExpr->pLeft->x.pSelect->pEList->nExpr );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pExpr) );
    return sqlite3ExprAffinity(pExpr->x.pList->a[0].pExpr);
  }
  return pExpr->affExpr;
}